

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::
strTree<char_const*&,char_const(&)[2],kj::StringTree,char_const(&)[2],kj::String&,char_const(&)[2],char_const*&>
          (StringTree *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],
          StringTree *params_2,char (*params_3) [2],String *params_4,char (*params_5) [2],
          char **params_6)

{
  Branch *__s;
  ArrayDisposer *pAVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff68;
  undefined1 local_90 [24];
  ArrayDisposer *local_78;
  undefined1 local_70 [24];
  ArrayDisposer *local_58;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  __s = *(Branch **)this;
  local_70._8_8_ = strlen((char *)__s);
  local_70._0_8_ = __s;
  local_78 = (ArrayDisposer *)strlen((char *)params);
  local_90._16_8_ = params;
  local_90._8_8_ = strlen((char *)params_2);
  pAVar1 = *(ArrayDisposer **)(params_3 + 4);
  local_40.ptr = (char *)pAVar1;
  if (pAVar1 != (ArrayDisposer *)0x0) {
    local_40.ptr = *(char **)params_3;
  }
  local_40.size_ = (size_t)(ArrayDisposer *)0x0;
  if (pAVar1 != (ArrayDisposer *)0x0) {
    local_40.size_ = (size_t)(pAVar1 + -1);
  }
  local_90._0_8_ = params_2;
  local_50.size_ = strlen((char *)params_4);
  local_50.ptr = (char *)params_4;
  pAVar1 = *(ArrayDisposer **)params_5;
  local_58 = (ArrayDisposer *)strlen((char *)pAVar1);
  local_70._16_8_ = pAVar1;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)local_70,(ArrayPtr<const_char> *)(local_90 + 0x10)
             ,(ArrayPtr<const_char> *)params_1,(StringTree *)local_90,&local_40,&local_50,
             (ArrayPtr<const_char> *)(local_70 + 0x10),in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}